

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O3

error_code __thiscall flowtest::Parser::parse(Parser *this,Report *report)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Message MStack_88;
  
  Lexer::consume(&this->lexer_,InitializerMark);
  if ((this->lexer_).currentToken_ != Eof) {
    do {
      parseMessage(&MStack_88,this);
      (*report->_vptr_Report[2])(report,&MStack_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)MStack_88.text._M_dataplus._M_p != &MStack_88.text.field_2) {
        operator_delete(MStack_88.text._M_dataplus._M_p,
                        MStack_88.text.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)MStack_88.sourceLocation.filename._M_dataplus._M_p !=
          &MStack_88.sourceLocation.filename.field_2) {
        operator_delete(MStack_88.sourceLocation.filename._M_dataplus._M_p,
                        MStack_88.sourceLocation.filename.field_2._M_allocated_capacity + 1);
      }
    } while ((this->lexer_).currentToken_ != Eof);
  }
  uVar2 = std::_V2::system_category();
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return (error_code)(auVar1 << 0x40);
}

Assistant:

std::error_code Parser::parse(flow::diagnostics::Report* report) {
  lexer_.consume(Token::InitializerMark);

  while (!lexer_.eof())
    report->push_back(parseMessage());

  return std::error_code{};
}